

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

void NULLC::CollectUnmarkedBlock(Range *curr)

{
  undefined8 *puVar1;
  ulong uVar2;
  void *pvVar3;
  long lVar4;
  uint uVar5;
  
  uVar2 = *(ulong *)((long)curr->start + 4);
  if ((uVar2 & 1) != 0) {
    return;
  }
  if (((uint)uVar2 & 0xc) == 4) {
    if (DAT_00243efc == _DAT_00243ef8) {
      FastVector<NULLC::Range,_false,_false>::grow_and_add
                ((FastVector<NULLC::Range,_false,_false> *)&blocksToFinalize,DAT_00243efc,curr);
      return;
    }
    lVar4 = blocksToFinalize;
    uVar5 = DAT_00243efc;
    DAT_00243efc = DAT_00243efc + 1;
  }
  else {
    if (DAT_00243f0c == _DAT_00243f08) {
      FastVector<NULLC::Range,_false,_false>::grow_and_add
                ((FastVector<NULLC::Range,_false,_false> *)&blocksToFree,DAT_00243f0c,curr);
      return;
    }
    lVar4 = blocksToFree;
    uVar5 = DAT_00243f0c;
    DAT_00243f0c = DAT_00243f0c + 1;
  }
  pvVar3 = curr->end;
  puVar1 = (undefined8 *)(lVar4 + (ulong)uVar5 * 0x10);
  *puVar1 = curr->start;
  puVar1[1] = pvVar3;
  return;
}

Assistant:

void NULLC::CollectUnmarkedBlock(Range& curr)
{
	void *block = curr.start;

	markerType &marker = *(markerType*)((char*)block + 4);

	if(!(marker & NULLC::OBJECT_VISIBLE))
	{
		if((marker & NULLC::OBJECT_FINALIZABLE) && !(marker & NULLC::OBJECT_FINALIZED))
		{
			blocksToFinalize.push_back(curr);
		}
		else
		{
			blocksToFree.push_back(curr);
		}
	}
}